

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

void read_zip64_eocd(archive_read *a,zip *zip,char *p)

{
  uint32_t uVar1;
  uint64_t uVar2;
  int64_t iVar3;
  void *pvVar4;
  size_t min;
  uint64_t uVar5;
  int64_t eocd64_size;
  int64_t eocd64_offset;
  char *p_local;
  zip *zip_local;
  archive_read *a_local;
  
  uVar1 = archive_le32dec(p + 4);
  if ((uVar1 == 0) && (uVar1 = archive_le32dec(p + 0x10), uVar1 == 1)) {
    uVar2 = archive_le64dec(p + 8);
    iVar3 = __archive_read_seek(a,uVar2,0);
    if ((-1 < iVar3) &&
       (pvVar4 = __archive_read_ahead(a,0x38,(ssize_t *)0x0), pvVar4 != (void *)0x0)) {
      uVar2 = archive_le64dec((void *)((long)pvVar4 + 4));
      min = uVar2 + 0xc;
      if ((((0x37 < (long)min) && ((long)min < 0x4001)) &&
          (pvVar4 = __archive_read_ahead(a,min,(ssize_t *)0x0), pvVar4 != (void *)0x0)) &&
         ((uVar1 = archive_le32dec((void *)((long)pvVar4 + 0x10)), uVar1 == 0 &&
          (uVar1 = archive_le32dec((void *)((long)pvVar4 + 0x14)), uVar1 == 0)))) {
        uVar2 = archive_le64dec((void *)((long)pvVar4 + 0x18));
        uVar5 = archive_le64dec((void *)((long)pvVar4 + 0x20));
        if (uVar2 == uVar5) {
          uVar2 = archive_le64dec((void *)((long)pvVar4 + 0x30));
          zip->central_directory_offset = uVar2;
        }
      }
    }
  }
  return;
}

Assistant:

static void
read_zip64_eocd(struct archive_read *a, struct zip *zip, const char *p)
{
	int64_t eocd64_offset;
	int64_t eocd64_size;

	/* Sanity-check the locator record. */

	/* Central dir must be on first volume. */
	if (archive_le32dec(p + 4) != 0)
		return;
	/* Must be only a single volume. */
	if (archive_le32dec(p + 16) != 1)
		return;

	/* Find the Zip64 EOCD record. */
	eocd64_offset = archive_le64dec(p + 8);
	if (__archive_read_seek(a, eocd64_offset, SEEK_SET) < 0)
		return;
	if ((p = __archive_read_ahead(a, 56, NULL)) == NULL)
		return;
	/* Make sure we can read all of it. */
	eocd64_size = archive_le64dec(p + 4) + 12;
	if (eocd64_size < 56 || eocd64_size > 16384)
		return;
	if ((p = __archive_read_ahead(a, (size_t)eocd64_size, NULL)) == NULL)
		return;

	/* Sanity-check the EOCD64 */
	if (archive_le32dec(p + 16) != 0) /* Must be disk #0 */
		return;
	if (archive_le32dec(p + 20) != 0) /* CD must be on disk #0 */
		return;
	/* CD can't be split. */
	if (archive_le64dec(p + 24) != archive_le64dec(p + 32))
		return;

	/* Save the central directory offset for later use. */
	zip->central_directory_offset = archive_le64dec(p + 48);
}